

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_aggregates.cpp
# Opt level: O1

ScalarFunction * duckdb::ListDistinctFun::GetFunction(void)

{
  ScalarFunction *in_RDI;
  initializer_list<duckdb::LogicalType> __l;
  allocator_type local_c9;
  code *local_c8;
  undefined8 uStack_c0;
  code *local_b8;
  code *pcStack_b0;
  LogicalType local_a8 [24];
  LogicalType local_90 [24];
  LogicalType local_78 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_60;
  LogicalType local_48 [24];
  LogicalType local_30 [24];
  
  duckdb::LogicalType::LogicalType(local_30,ANY);
  duckdb::LogicalType::LIST(local_78);
  __l._M_len = 1;
  __l._M_array = local_78;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_60,__l,&local_c9);
  duckdb::LogicalType::LogicalType(local_a8,ANY);
  duckdb::LogicalType::LIST(local_90);
  uStack_c0 = 0;
  local_c8 = ListDistinctFunction;
  pcStack_b0 = std::
               _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
               ::_M_invoke;
  local_b8 = std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
             ::_M_manager;
  duckdb::LogicalType::LogicalType(local_48,INVALID);
  duckdb::ScalarFunction::ScalarFunction();
  duckdb::LogicalType::~LogicalType(local_48);
  if (local_b8 != (code *)0x0) {
    (*local_b8)(&local_c8,&local_c8,3);
  }
  duckdb::LogicalType::~LogicalType(local_90);
  duckdb::LogicalType::~LogicalType(local_a8);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_60);
  duckdb::LogicalType::~LogicalType(local_78);
  duckdb::LogicalType::~LogicalType(local_30);
  return in_RDI;
}

Assistant:

ScalarFunction ListDistinctFun::GetFunction() {
	return ScalarFunction({LogicalType::LIST(LogicalType::ANY)}, LogicalType::LIST(LogicalType::ANY),
	                      ListDistinctFunction, ListDistinctBind, nullptr, nullptr, ListAggregatesInitLocalState);
}